

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsview.cpp
# Opt level: O0

void QGraphicsView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPointF _t3;
  QPointF _t2;
  QRect _t1;
  bool bVar1;
  QObject QVar2;
  Alignment AVar3;
  DragMode DVar4;
  ViewportAnchor VVar5;
  ViewportUpdateMode VVar6;
  ItemSelectionMode IVar7;
  QRectF *rect;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QGraphicsView *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QGraphicsView *_t;
  QRectF *in_stack_fffffffffffffe88;
  QGraphicsViewPrivate *in_stack_fffffffffffffe90;
  QGraphicsViewPrivate *this;
  undefined4 in_stack_fffffffffffffe98;
  QFlagsStorage<QGraphicsView::OptimizationFlag> in_stack_fffffffffffffe9c;
  QGraphicsViewPrivate *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  QFlagsStorage<QGraphicsView::CacheModeFlag> in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffeb8;
  QGraphicsViewPrivate *in_stack_fffffffffffffec0;
  QFlagsStorage<QGraphicsScene::SceneLayer> in_stack_fffffffffffffeec;
  QList<QRectF> *in_stack_ffffffffffffff00;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  QBrush local_a0 [8];
  QBrush local_98 [8];
  QMetaTypeInterface *local_90;
  QMetaType local_88;
  QMetaTypeInterface *local_80;
  QMetaType local_78;
  QMetaType local_70 [2];
  QRectF local_60;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      local_18 = **(undefined8 **)(in_RCX + 8);
      local_10 = (*(undefined8 **)(in_RCX + 8))[1];
      local_28 = **(undefined8 **)(in_RCX + 0x10);
      local_20 = (*(undefined8 **)(in_RCX + 0x10))[1];
      local_38 = **(undefined8 **)(in_RCX + 0x18);
      local_30 = (*(undefined8 **)(in_RCX + 0x18))[1];
      _t1.y1.m_i = in_stack_fffffffffffffeb4;
      _t1.x1.m_i = in_stack_fffffffffffffeb0;
      _t1._8_8_ = in_stack_fffffffffffffeb8;
      _t2.yp._0_4_ = in_stack_fffffffffffffea8;
      _t2.xp = (qreal)in_stack_fffffffffffffea0;
      _t2.yp._4_4_ = in_stack_fffffffffffffeac.i;
      _t3.yp._0_4_ = in_stack_fffffffffffffe98;
      _t3.xp = (qreal)in_stack_fffffffffffffe90;
      _t3.yp._4_4_ = in_stack_fffffffffffffe9c.i;
      rubberBandChanged((QGraphicsView *)in_stack_fffffffffffffe88,_t1,_t2,_t3);
      break;
    case 1:
      updateScene(in_RDI,in_stack_ffffffffffffff00);
      break;
    case 2:
      local_3c = **(undefined4 **)(in_RCX + 0x10);
      invalidateScene((QGraphicsView *)
                      CONCAT44(in_stack_fffffffffffffeac.i,in_stack_fffffffffffffea8),
                      (QRectF *)in_stack_fffffffffffffea0,(SceneLayers)in_stack_fffffffffffffeec.i);
      break;
    case 3:
      QFlags<QGraphicsScene::SceneLayer>::QFlags
                ((QFlags<QGraphicsScene::SceneLayer> *)in_stack_fffffffffffffe90,
                 (SceneLayer)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      invalidateScene((QGraphicsView *)
                      CONCAT44(in_stack_fffffffffffffeac.i,in_stack_fffffffffffffea8),
                      (QRectF *)in_stack_fffffffffffffea0,(SceneLayers)in_stack_fffffffffffffeec.i);
      break;
    case 4:
      QRectF::QRectF(&local_60);
      QFlags<QGraphicsScene::SceneLayer>::QFlags
                ((QFlags<QGraphicsScene::SceneLayer> *)in_stack_fffffffffffffe90,
                 (SceneLayer)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      invalidateScene((QGraphicsView *)
                      CONCAT44(in_stack_fffffffffffffeac.i,in_stack_fffffffffffffea8),
                      (QRectF *)in_stack_fffffffffffffea0,(SceneLayers)in_stack_fffffffffffffeec.i);
      break;
    case 5:
      updateSceneRect((QGraphicsView *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      break;
    case 6:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1a8)
      )();
      break;
    case 7:
      d_func((QGraphicsView *)0xa41227);
      QGraphicsViewPrivate::_q_setViewportCursor
                (in_stack_fffffffffffffe90,(QCursor *)in_stack_fffffffffffffe88);
      break;
    case 8:
      d_func((QGraphicsView *)0xa4124a);
      QGraphicsViewPrivate::_q_unsetViewportCursor(in_stack_fffffffffffffec0);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 1) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_80 = (QMetaTypeInterface *)QMetaType::fromType<QList<QRectF>>();
        **(undefined8 **)in_RCX = local_80;
      }
      else {
        memset(&local_78,0,8);
        QMetaType::QMetaType(&local_78);
        **(undefined8 **)in_RCX = local_78.d_ptr;
      }
    }
    else if (in_EDX == 6) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_90 = (QMetaTypeInterface *)QMetaType::fromType<QWidget*>();
        **(undefined8 **)in_RCX = local_90;
      }
      else {
        memset(&local_88,0,8);
        QMetaType::QMetaType(&local_88);
        **(undefined8 **)in_RCX = local_88.d_ptr;
      }
    }
    else {
      memset(local_70,0,8);
      QMetaType::QMetaType(local_70);
      **(undefined8 **)in_RCX = local_70[0].d_ptr;
    }
  }
  if ((in_ESI != 5) ||
     (bVar1 = QtMocHelpers::indexOfMethod<void(QGraphicsView::*)(QRect,QPointF,QPointF)>
                        (in_RCX,(void **)rubberBandChanged,0,0), !bVar1)) {
    if (in_ESI == 1) {
      this = *(QGraphicsViewPrivate **)in_RCX;
      in_stack_fffffffffffffeac.i = 0;
      switch(in_EDX) {
      case 0:
        backgroundBrush((QGraphicsView *)
                        CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
        QBrush::operator=((QBrush *)in_stack_fffffffffffffe90,(QBrush *)in_stack_fffffffffffffe88);
        QBrush::~QBrush(local_98);
        break;
      case 1:
        foregroundBrush((QGraphicsView *)
                        CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
        QBrush::operator=((QBrush *)in_stack_fffffffffffffe90,(QBrush *)in_stack_fffffffffffffe88);
        QBrush::~QBrush(local_a0);
        break;
      case 2:
        QVar2 = (QObject)isInteractive((QGraphicsView *)in_stack_fffffffffffffe90);
        *(QObject *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
          super_QObjectPrivate = QVar2;
        break;
      case 3:
        sceneRect((QGraphicsView *)in_stack_fffffffffffffea0);
        *(undefined8 *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
             local_c0;
        *(undefined8 *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
          field_0x8 = local_b8;
        *(undefined8 *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
          field_0x10 = local_b0;
        *(undefined8 *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
          field_0x18 = local_a8;
        break;
      case 4:
        AVar3 = alignment((QGraphicsView *)in_stack_fffffffffffffe90);
        *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
             AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i;
        break;
      case 5:
        renderHints((QGraphicsView *)in_stack_fffffffffffffe90);
        QtMocHelpers::assignFlags<QFlags<QPainter::RenderHint>>
                  ((void *)0xa41566,
                   (QFlagsStorageHelper<QPainter::RenderHint,_4>)
                   SUB84((ulong)in_stack_fffffffffffffe88 >> 0x20,0));
        in_stack_fffffffffffffea0 = this;
        break;
      case 6:
        DVar4 = dragMode((QGraphicsView *)in_stack_fffffffffffffe90);
        *(DragMode *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate = DVar4;
        break;
      case 7:
        in_stack_fffffffffffffe98 = SUB84(this,0);
        in_stack_fffffffffffffe9c.i = (Int)((ulong)this >> 0x20);
        cacheMode((QGraphicsView *)in_stack_fffffffffffffe90);
        QtMocHelpers::assignFlags<QFlags<QGraphicsView::CacheModeFlag>>
                  ((void *)0xa415af,
                   (QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4>)
                   SUB84((ulong)in_stack_fffffffffffffe88 >> 0x20,0));
        break;
      case 8:
        VVar5 = transformationAnchor((QGraphicsView *)in_stack_fffffffffffffe90);
        *(ViewportAnchor *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate = VVar5;
        break;
      case 9:
        VVar5 = resizeAnchor((QGraphicsView *)in_stack_fffffffffffffe90);
        *(ViewportAnchor *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate = VVar5;
        break;
      case 10:
        VVar6 = viewportUpdateMode((QGraphicsView *)in_stack_fffffffffffffe90);
        *(ViewportUpdateMode *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate = VVar6;
        break;
      case 0xb:
        IVar7 = rubberBandSelectionMode((QGraphicsView *)in_stack_fffffffffffffe90);
        *(ItemSelectionMode *)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate = IVar7;
        break;
      case 0xc:
        optimizationFlags((QGraphicsView *)this);
        QtMocHelpers::assignFlags<QFlags<QGraphicsView::OptimizationFlag>>
                  ((void *)0xa4163d,
                   (QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>)
                   SUB84((ulong)in_stack_fffffffffffffe88 >> 0x20,0));
        in_stack_fffffffffffffe90 = this;
      }
    }
    if (in_ESI == 2) {
      rect = (QRectF *)(ulong)in_EDX;
      switch(rect) {
      case (QRectF *)0x0:
        setBackgroundBrush((QGraphicsView *)in_stack_fffffffffffffe90,(QBrush *)rect);
        break;
      case (QRectF *)0x1:
        setForegroundBrush((QGraphicsView *)in_stack_fffffffffffffe90,(QBrush *)rect);
        break;
      case (QRectF *)0x2:
        setInteractive((QGraphicsView *)in_stack_fffffffffffffe90,false);
        break;
      case (QRectF *)0x3:
        setSceneRect((QGraphicsView *)in_stack_fffffffffffffe90,rect);
        break;
      case (QRectF *)0x4:
        setAlignment((QGraphicsView *)rect,(Alignment)in_stack_fffffffffffffe9c.i);
        break;
      case (QRectF *)0x5:
        setRenderHints((QGraphicsView *)rect,(RenderHints)in_stack_fffffffffffffe9c.i);
        break;
      case (QRectF *)0x6:
        setDragMode((QGraphicsView *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c.i);
        break;
      case (QRectF *)0x7:
        setCacheMode((QGraphicsView *)
                     CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98),
                     (CacheMode)in_stack_fffffffffffffeac.i);
        break;
      case (QRectF *)0x8:
        setTransformationAnchor((QGraphicsView *)in_stack_fffffffffffffe90,NoAnchor);
        break;
      case (QRectF *)0x9:
        setResizeAnchor((QGraphicsView *)in_stack_fffffffffffffe90,NoAnchor);
        break;
      case (QRectF *)0xa:
        setViewportUpdateMode((QGraphicsView *)in_stack_fffffffffffffe90,FullViewportUpdate);
        break;
      case (QRectF *)0xb:
        setRubberBandSelectionMode((QGraphicsView *)in_stack_fffffffffffffe90,ContainsItemShape);
        break;
      case (QRectF *)0xc:
        setOptimizationFlags
                  ((QGraphicsView *)in_stack_fffffffffffffe90,
                   (OptimizationFlags)in_stack_fffffffffffffe9c.i);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rubberBandChanged((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[3]))); break;
        case 1: _t->updateScene((*reinterpret_cast< std::add_pointer_t<QList<QRectF>>>(_a[1]))); break;
        case 2: _t->invalidateScene((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QGraphicsScene::SceneLayers>>(_a[2]))); break;
        case 3: _t->invalidateScene((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 4: _t->invalidateScene(); break;
        case 5: _t->updateSceneRect((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 6: _t->setupViewport((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 7: _t->d_func()->_q_setViewportCursor((*reinterpret_cast< std::add_pointer_t<QCursor>>(_a[1]))); break;
        case 8: _t->d_func()->_q_unsetViewportCursor(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QRectF> >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsView::*)(QRect , QPointF , QPointF )>(_a, &QGraphicsView::rubberBandChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QBrush*>(_v) = _t->backgroundBrush(); break;
        case 1: *reinterpret_cast<QBrush*>(_v) = _t->foregroundBrush(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isInteractive(); break;
        case 3: *reinterpret_cast<QRectF*>(_v) = _t->sceneRect(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: QtMocHelpers::assignFlags<QPainter::RenderHints>(_v, _t->renderHints()); break;
        case 6: *reinterpret_cast<DragMode*>(_v) = _t->dragMode(); break;
        case 7: QtMocHelpers::assignFlags<CacheMode>(_v, _t->cacheMode()); break;
        case 8: *reinterpret_cast<ViewportAnchor*>(_v) = _t->transformationAnchor(); break;
        case 9: *reinterpret_cast<ViewportAnchor*>(_v) = _t->resizeAnchor(); break;
        case 10: *reinterpret_cast<ViewportUpdateMode*>(_v) = _t->viewportUpdateMode(); break;
        case 11: *reinterpret_cast<Qt::ItemSelectionMode*>(_v) = _t->rubberBandSelectionMode(); break;
        case 12: QtMocHelpers::assignFlags<OptimizationFlags>(_v, _t->optimizationFlags()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBackgroundBrush(*reinterpret_cast<QBrush*>(_v)); break;
        case 1: _t->setForegroundBrush(*reinterpret_cast<QBrush*>(_v)); break;
        case 2: _t->setInteractive(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setSceneRect(*reinterpret_cast<QRectF*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setRenderHints(*reinterpret_cast<QPainter::RenderHints*>(_v)); break;
        case 6: _t->setDragMode(*reinterpret_cast<DragMode*>(_v)); break;
        case 7: _t->setCacheMode(*reinterpret_cast<CacheMode*>(_v)); break;
        case 8: _t->setTransformationAnchor(*reinterpret_cast<ViewportAnchor*>(_v)); break;
        case 9: _t->setResizeAnchor(*reinterpret_cast<ViewportAnchor*>(_v)); break;
        case 10: _t->setViewportUpdateMode(*reinterpret_cast<ViewportUpdateMode*>(_v)); break;
        case 11: _t->setRubberBandSelectionMode(*reinterpret_cast<Qt::ItemSelectionMode*>(_v)); break;
        case 12: _t->setOptimizationFlags(*reinterpret_cast<OptimizationFlags*>(_v)); break;
        default: break;
        }
    }
}